

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_common.c
# Opt level: O2

PpRgbCfg * get_pp_rgb_Cfg(MppFrameFormat fmt)

{
  PpRgbCfg *pPVar1;
  PpRgbCfg *pPVar2;
  PpRgbCfg *pPVar3;
  long lVar4;
  
  pPVar3 = pp_rgb_le_cfgs;
  if ((fmt >> 0x18 & 1) == 0) {
    pPVar3 = pp_rgb_cfgs;
  }
  lVar4 = 0xb;
  pPVar3 = pPVar3 + -1;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      return (PpRgbCfg *)0x0;
    }
    pPVar1 = pPVar3 + 1;
    pPVar2 = pPVar3 + 1;
    pPVar3 = pPVar1;
  } while (pPVar2->fmt != fmt);
  return pPVar1;
}

Assistant:

PpRgbCfg* get_pp_rgb_Cfg(MppFrameFormat fmt)
{
    PpRgbCfg* cfg = NULL;
    PpRgbCfg* cfg_array = NULL;
    RK_U8 i = 0;

    if (MPP_FRAME_FMT_IS_LE(fmt))
        cfg_array = pp_rgb_le_cfgs;
    else
        cfg_array = pp_rgb_cfgs;

    for (i = 0; i < PP_RGB_CFG_LENTH; i++) {
        if (cfg_array[i].fmt ==  fmt) {
            cfg = &cfg_array[i];
            break;
        }
    }

    return cfg;
}